

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O0

ktx_error_code_e ktxFileStream_read(ktxStream *str,void *dst,ktx_size_t count)

{
  int iVar1;
  size_t sVar2;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  ktx_size_t nread;
  ktx_error_code_e local_4;
  
  if ((in_RDI == 0) || (in_RSI == (void *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    if (*(int *)(in_RDI + 0x38) != 1) {
      __assert_fail("str->type == eStreamTypeFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                    ,0x55,
                    "ktx_error_code_e ktxFileStream_read(ktxStream *, void *, const ktx_size_t)");
    }
    sVar2 = fread(in_RSI,1,in_RDX,*(FILE **)(in_RDI + 0x40));
    if (sVar2 == in_RDX) {
      *(size_t *)(in_RDI + 0x58) = in_RDX + *(long *)(in_RDI + 0x58);
      local_4 = KTX_SUCCESS;
    }
    else {
      iVar1 = feof(*(FILE **)(in_RDI + 0x40));
      if (iVar1 == 0) {
        local_4 = KTX_FILE_READ_ERROR;
      }
      else {
        local_4 = KTX_FILE_UNEXPECTED_EOF;
      }
    }
  }
  return local_4;
}

Assistant:

static
KTX_error_code ktxFileStream_read(ktxStream* str, void* dst, const ktx_size_t count)
{
    ktx_size_t nread;

    if (!str || !dst)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    if ((nread = fread(dst, 1, count, str->data.file)) != count) {
        if (feof(str->data.file)) {
            return KTX_FILE_UNEXPECTED_EOF;
        } else {
            return KTX_FILE_READ_ERROR;
        }
    }
    str->readpos += count;

    return KTX_SUCCESS;
}